

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

void * Wlc_NtkToNdr(Wlc_Ntk_t *pNtk)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int iVar4;
  Ndr_Data_t *pNVar5;
  uchar *puVar6;
  uint *puVar7;
  Vec_Int_t *p_00;
  int *__ptr;
  long lVar8;
  ulong uVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar10;
  uint uVar11;
  int Fill;
  char *pOutputs;
  uint uVar12;
  long lVar13;
  int *in_stack_ffffffffffffff98;
  char *pFunction;
  int local_3c;
  Ndr_Data_t *p;
  
  pNVar5 = (Ndr_Data_t *)malloc(0x18);
  pNVar5->nCap = 0x10;
  puVar6 = (uchar *)malloc(0x10);
  pNVar5->pHead = puVar6;
  puVar7 = (uint *)malloc(0x100);
  pNVar5->pBody = puVar7;
  builtin_memcpy(puVar6,"\x01\a\x02\a",4);
  pNVar5->nSize = 4;
  puVar7[0] = 4;
  puVar7[1] = 1;
  puVar7[2] = 2;
  puVar7[3] = 1;
  p = pNVar5;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  pFunction = (char *)0x3639fd;
  __ptr = (int *)malloc(0x40);
  p_00->pArray = __ptr;
  if (0 < (pNtk->vPis).nSize) {
    lVar13 = 0;
    do {
      iVar4 = (pNtk->vPis).pArray[lVar13];
      lVar8 = (long)iVar4;
      if ((lVar8 < 1) || (pNtk->nObjsAlloc <= iVar4)) goto LAB_00363d90;
      pWVar2 = pNtk->pObjs;
      in_stack_ffffffffffffff98 = (int *)0x0;
      local_3c = iVar4;
      Ndr_AddObject(p,0x102,3,pWVar2[lVar8].End,pWVar2[lVar8].Beg,*(uint *)(pWVar2 + lVar8) >> 6 & 1
                    ,0,0,(int *)0x1,(int)&local_3c,(int *)0x0,pFunction);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pNtk->vPis).nSize);
  }
  local_3c = 1;
  iVar4 = pNtk->iObj;
  if (1 < iVar4) {
    lVar13 = 1;
    do {
      if (pNtk->nObjsAlloc <= lVar13) goto LAB_00363d90;
      uVar1 = *(ushort *)(pNtk->pObjs + lVar13);
      if ((uVar1 & 0x3e) != 0) {
        pWVar2 = pNtk->pObjs + lVar13;
        p_00->nSize = 0;
        uVar9 = (ulong)pWVar2->nFanins;
        if (0 < (int)pWVar2->nFanins) {
          lVar8 = 0;
          do {
            if ((2 < (uint)uVar9) ||
               (paVar10 = &pWVar2->field_10, (*(uint *)pWVar2 & 0x3f | 0x10) == 0x16)) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar2->field_10).pFanins[0];
            }
            pFunction = (char *)0x363b15;
            Vec_IntPush(p_00,paVar10->Fanins[lVar8]);
            lVar8 = lVar8 + 1;
            uVar9 = (ulong)(int)pWVar2->nFanins;
          } while (lVar8 < (long)uVar9);
          uVar1 = *(ushort *)pWVar2;
        }
        if ((uVar1 & 0x3f) == 6) {
          iVar3 = pWVar2->End - pWVar2->Beg;
          iVar4 = -iVar3;
          if (0 < iVar3) {
            iVar4 = iVar3;
          }
          pFunction = (char *)0x363b4f;
          Ndr_ObjWriteConstant((uint *)(pWVar2->field_10).pFanins[0],iVar4 + 1);
          uVar1 = *(ushort *)pWVar2;
          pOutputs = Ndr_ObjWriteConstant::Buffer;
        }
        else {
          pOutputs = (char *)0x0;
        }
        uVar12 = (uint)uVar1;
        uVar11 = uVar12 & 0x3f;
        if ((short)uVar11 == 3) {
          uVar11 = ((pWVar2->field_10).Fanins[1] + (pNtk->vPos).nSize) - (pNtk->vPis).nSize;
          if (((int)uVar11 < 0) || ((pNtk->vCos).nSize <= (int)uVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar4 = (pNtk->vCos).pArray[uVar11];
          if ((iVar4 < 1) || (pNtk->nObjsAlloc <= iVar4)) goto LAB_00363d90;
          if (p_00->nSize != 0) {
            __assert_fail("Vec_IntSize(vFanins) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0xde,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
          }
          Vec_IntPush(p_00,iVar4);
          pFunction = (char *)0x363c1e;
          Vec_IntFillExtra(p_00,7,Fill);
          uVar12 = (uint)*(ushort *)pWVar2;
          iVar4 = 0x59;
        }
        else {
          if (uVar11 == 8) {
            paVar10 = &pWVar2->field_10;
            if (2 < pWVar2->nFanins) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
            }
            lVar8 = (long)paVar10->Fanins[0];
            if ((lVar8 < 1) || (pNtk->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_00363d90;
            iVar4 = 0x2b;
            if (pNtk->pObjs[lVar8].End != pNtk->pObjs[lVar8].Beg) goto LAB_00363c28;
          }
          pFunction = (char *)0x363bba;
          iVar4 = Ndr_TypeWlc2Ndr(uVar11);
          if (iVar4 < 1) {
            __assert_fail("Type > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0xe5,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
          }
        }
LAB_00363c28:
        __ptr = p_00->pArray;
        in_stack_ffffffffffffff98 = (int *)0x0;
        Ndr_AddObject(p,0x102,iVar4,pWVar2->End,pWVar2->Beg,uVar12 >> 6 & 1,p_00->nSize,(int)__ptr,
                      (int *)0x1,(int)&local_3c,(int *)pOutputs,pFunction);
        iVar4 = pNtk->iObj;
      }
      lVar13 = lVar13 + 1;
      local_3c = (int)lVar13;
    } while (lVar13 < iVar4);
    if (1 < iVar4) {
      lVar13 = 1;
      lVar8 = 0x18;
      do {
        if (pNtk->nObjsAlloc <= lVar13) {
LAB_00363d90:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar2 = pNtk->pObjs;
        if (((&pWVar2->field_0x1)[lVar8] & 2) != 0) {
          if (p_00->nCap < 1) {
            if (__ptr == (int *)0x0) {
              pFunction = (char *)0x363cdf;
              __ptr = (int *)malloc(4);
            }
            else {
              pFunction = (char *)0x363cd3;
              __ptr = (int *)realloc(__ptr,4);
            }
            p_00->pArray = __ptr;
            if (__ptr == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_00->nCap = 1;
          }
          *__ptr = (int)lVar13;
          p_00->nSize = 1;
          in_stack_ffffffffffffff98 = (int *)((ulong)in_stack_ffffffffffffff98 & 0xffffffff00000000)
          ;
          Ndr_AddObject(p,0x102,4,*(int *)((long)&pWVar2->End + lVar8),
                        *(int *)((long)&pWVar2->Beg + lVar8),
                        *(uint *)(&pWVar2->field_0x0 + lVar8) >> 6 & 1,1,(int)__ptr,
                        in_stack_ffffffffffffff98,0,(int *)0x0,pFunction);
          iVar4 = pNtk->iObj;
        }
        lVar13 = lVar13 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar13 < iVar4);
    }
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(p_00);
  return p;
}

Assistant:

void * Wlc_NtkToNdr( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, iOutId, Type;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_NtkForEachPi( pNtk, pObj, i ) 
    {
        iOutId = Wlc_ObjId(pNtk, pObj);
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            0, NULL,      1, &iOutId,  NULL  ); // no fanins
    }
    // add internal nodes 
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        char * pFunction = NULL;
        if ( Wlc_ObjIsPi(pObj) || pObj->Type == 0 )
            continue;
        Vec_IntClear( vFanins );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        if ( pObj->Type == WLC_OBJ_CONST )
            pFunction = Ndr_ObjWriteConstant( (unsigned *)Wlc_ObjFanins(pObj), Wlc_ObjRange(pObj) );
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjRange(Wlc_ObjFanin0(pNtk, pObj)) > 1 )
            Type = ABC_OPER_SEL_NMUX;
        else if ( pObj->Type == WLC_OBJ_FO )
        {
            Wlc_Obj_t * pFi = Wlc_ObjFo2Fi( pNtk, pObj );
            assert( Vec_IntSize(vFanins) == 0 );
            Vec_IntPush( vFanins, Wlc_ObjId(pNtk, pFi) );
            Vec_IntFillExtra( vFanins, 7, 0 );
            Type = ABC_OPER_DFFRSE;
        }
        else
            Type = Ndr_TypeWlc2Ndr(pObj->Type);
        assert( Type > 0 );
        Ndr_AddObject( pDesign, ModId, Type, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iOutId,  pFunction  ); 
    }
    // add primary outputs
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        if ( !Wlc_ObjIsPo(pObj) )
            continue;
        Vec_IntFill( vFanins, 1, iOutId );
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            pObj->End, pObj->Beg, pObj->Signed,   
            1, Vec_IntArray(vFanins),  0, NULL,  NULL ); 
    }
    Vec_IntFree( vFanins );
    return pDesign;
}